

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CncFileDescriptor.h
# Opt level: O0

AtomicBuffer * aeron::CncFileDescriptor::createCounterValuesBuffer(ptr_t *cncFile)

{
  index_t iVar1;
  element_type *peVar2;
  uint8_t *puVar3;
  MetaDataDefn *pMVar4;
  AtomicBuffer *in_RDI;
  uint8_t *basePtr;
  MetaDataDefn *metaData;
  AtomicBuffer metaDataBuffer;
  undefined4 in_stack_ffffffffffffff78;
  index_t in_stack_ffffffffffffff7c;
  AtomicBuffer *in_stack_ffffffffffffff80;
  AtomicBuffer local_28;
  
  peVar2 = std::
           __shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e62f3);
  puVar3 = util::MemoryMappedFile::getMemoryPtr(peVar2);
  peVar2 = std::
           __shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e630a);
  util::MemoryMappedFile::getMemorySize(peVar2);
  iVar1 = util::convertSizeToIndex(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  concurrent::AtomicBuffer::AtomicBuffer(&local_28,puVar3,(long)iVar1);
  pMVar4 = concurrent::AtomicBuffer::overlayStruct<aeron::CncFileDescriptor::MetaDataDefn>
                     (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  peVar2 = std::
           __shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e6358);
  puVar3 = util::MemoryMappedFile::getMemoryPtr(peVar2);
  concurrent::AtomicBuffer::AtomicBuffer
            (in_RDI,puVar3 + (long)pMVar4->counterMetadataBufferLength +
                             (long)pMVar4->toClientsBufferLength +
                             pMVar4->toDriverBufferLength + META_DATA_LENGTH,
             (long)pMVar4->counterValuesBufferLength);
  concurrent::AtomicBuffer::~AtomicBuffer(&local_28);
  return in_RDI;
}

Assistant:

inline static AtomicBuffer createCounterValuesBuffer(MemoryMappedFile::ptr_t cncFile)
{
    AtomicBuffer metaDataBuffer(cncFile->getMemoryPtr(), convertSizeToIndex(cncFile->getMemorySize()));

    const MetaDataDefn& metaData = metaDataBuffer.overlayStruct<MetaDataDefn>(0);
    std::uint8_t* basePtr =
        cncFile->getMemoryPtr() +
        META_DATA_LENGTH +
        metaData.toDriverBufferLength +
        metaData.toClientsBufferLength +
        metaData.counterMetadataBufferLength;

    return AtomicBuffer(basePtr, metaData.counterValuesBufferLength);
}